

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O0

void __thiscall HDualRow::create_Freemove(HDualRow *this,HVector *row_ep)

{
  bool bVar1;
  reference piVar2;
  int *piVar3;
  long *in_RDI;
  double alpha;
  int iCol;
  iterator sit;
  int sourceOut;
  double Ta;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  _Rb_tree_const_iterator<int> *in_stack_ffffffffffffff98;
  _Rb_tree_const_iterator<int> *local_60;
  _Self in_stack_ffffffffffffffb0;
  int iCol_00;
  HVector *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_const_iterator<int> local_28;
  int local_1c;
  _Rb_tree_const_iterator<int> *local_18;
  
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x156111);
  if (!bVar1) {
    if (*(int *)(*in_RDI + 0x584) < 10) {
      local_60 = (_Rb_tree_const_iterator<int> *)0x3e112e0be826d695;
    }
    else {
      in_stack_ffffffffffffff90 = 0x3eb0c6f7a0b5ed8d;
      in_stack_ffffffffffffff98 = (_Rb_tree_const_iterator<int> *)0x3e601b2b29a4692b;
      local_60 = in_stack_ffffffffffffff98;
      if (0x13 < *(int *)(*in_RDI + 0x584)) {
        in_stack_ffffffffffffff98 = (_Rb_tree_const_iterator<int> *)0x3eb0c6f7a0b5ed8d;
        local_60 = in_stack_ffffffffffffff98;
      }
    }
    local_18 = local_60;
    local_1c = 1;
    if ((double)in_RDI[0x13] < 0.0) {
      local_1c = -1;
    }
    std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_28);
    local_30 = (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88)
    ;
    local_28._M_node = local_30;
    while( true ) {
      iCol_00 = (int)((ulong)in_stack_ffffffffffffffb0._M_node >> 0x20);
      local_38._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
      bVar1 = std::operator!=(&local_28,&local_38);
      if (!bVar1) break;
      piVar2 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)0x15620e);
      iVar4 = *piVar2;
      HModel::getMatrix((HModel *)*in_RDI);
      in_stack_ffffffffffffffb8 =
           (HVector *)
           HMatrix::compute_dot
                     ((HMatrix *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
                      ,iCol_00);
      if ((double)local_18 < ABS((double)in_stack_ffffffffffffffb8)) {
        if ((double)in_stack_ffffffffffffffb8 * (double)local_1c <= 0.0) {
          piVar3 = HModel::getNonbasicMove((HModel *)0x156295);
          piVar3[iVar4] = -1;
        }
        else {
          piVar3 = HModel::getNonbasicMove((HModel *)0x15627a);
          piVar3[iVar4] = 1;
        }
      }
      in_stack_ffffffffffffffb0 =
           std::_Rb_tree_const_iterator<int>::operator++
                     (in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    }
  }
  return;
}

Assistant:

void HDualRow::create_Freemove(HVector *row_ep) {
    if (!freeList.empty()) {
        double Ta = workModel->countUpdate < 10 ? 1e-9 :
                    workModel->countUpdate < 20 ? 3e-8 : 1e-6;
        int sourceOut = workDelta < 0 ? -1 : 1;
        set<int>::iterator sit;
        for (sit = freeList.begin(); sit != freeList.end(); sit++) {
            int iCol = *sit;
            assert(iCol < workModel->getNumCol());
            double alpha = workModel->getMatrix()->compute_dot(*row_ep, iCol);
            if (fabs(alpha) > Ta) {
                if (alpha * sourceOut > 0)
                    workModel->getNonbasicMove()[iCol] = 1;
                else
                    workModel->getNonbasicMove()[iCol] = -1;
            }
        }
    }
}